

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O2

char * Abc_SopDecoderPos(Mem_Flex_t *pMan,int nValues)

{
  Vec_Str_t *p;
  char *pcVar1;
  int iVar2;
  int Num;
  
  if (1 < nValues) {
    p = Vec_StrAlloc((int)pMan);
    for (Num = 0; Num != nValues; Num = Num + 1) {
      for (iVar2 = 0; nValues != iVar2; iVar2 = iVar2 + 1) {
        pcVar1 = "- ";
        if (Num == iVar2) {
          pcVar1 = "1 ";
        }
        Vec_StrPrintStr(p,pcVar1);
      }
      Vec_StrPrintNum(p,Num);
      Vec_StrPush(p,'\n');
    }
    Vec_StrPush(p,'\0');
    pcVar1 = Abc_SopRegister(pMan,p->pArray);
    Vec_StrFree(p);
    return pcVar1;
  }
  __assert_fail("nValues > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcSop.c"
                ,0x475,"char *Abc_SopDecoderPos(Mem_Flex_t *, int)");
}

Assistant:

char * Abc_SopDecoderPos( Mem_Flex_t * pMan, int nValues )
{
    char * pResult;
    Vec_Str_t * vSop;
    int i, k;
    assert( nValues > 1 );
    vSop = Vec_StrAlloc( 100 );
    for ( i = 0; i < nValues; i++ )
    {
        for ( k = 0; k < nValues; k++ )
        {
            if ( k == i )
                Vec_StrPrintStr( vSop, "1 " );
            else
                Vec_StrPrintStr( vSop, "- " );
        }
        Vec_StrPrintNum( vSop, i );
        Vec_StrPush( vSop, '\n' );
    }
    Vec_StrPush( vSop, 0 );
    pResult = Abc_SopRegister( pMan, Vec_StrArray(vSop) );
    Vec_StrFree( vSop );
    return pResult;
}